

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O3

void __thiscall HMatrix::update(HMatrix *this,int columnIn,int columnOut)

{
  double dVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  pointer pdVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  
  iVar12 = this->numCol;
  if (columnIn < iVar12) {
    piVar4 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = (long)piVar4[columnIn];
    if (piVar4[columnIn] < piVar4[(long)columnIn + 1]) {
      piVar5 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->AR_Nend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        iVar12 = piVar5[lVar11];
        iVar2 = piVar6[iVar12];
        iVar3 = piVar7[iVar12];
        piVar7[iVar12] = iVar3 + -1;
        lVar14 = (long)iVar2 << 2;
        do {
          lVar13 = lVar14;
          lVar14 = lVar13 + 4;
        } while (*(int *)((long)piVar8 + lVar13) != columnIn);
        *(int *)((long)piVar8 + lVar13) = piVar8[(long)iVar3 + -1];
        piVar8[(long)iVar3 + -1] = columnIn;
        dVar1 = *(double *)((long)pdVar9 + lVar14 * 2 + -8);
        *(double *)((long)pdVar9 + lVar14 * 2 + -8) = pdVar9[(long)iVar3 + -1];
        pdVar9[(long)iVar3 + -1] = dVar1;
        lVar11 = lVar11 + 1;
      } while (lVar11 < piVar4[(long)columnIn + 1]);
      iVar12 = this->numCol;
    }
  }
  if (columnOut < iVar12) {
    piVar4 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = (long)piVar4[columnOut];
    if (piVar4[columnOut] < piVar4[(long)columnOut + 1]) {
      piVar5 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this->AR_Nend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        iVar12 = piVar5[lVar11];
        iVar2 = piVar6[iVar12];
        lVar13 = (long)iVar2;
        piVar6[iVar12] = iVar2 + 1;
        lVar14 = lVar13 * 4;
        do {
          lVar10 = lVar14;
          lVar14 = lVar10 + 4;
        } while (*(int *)((long)piVar7 + lVar10) != columnOut);
        *(int *)((long)piVar7 + lVar10) = piVar7[lVar13];
        piVar7[lVar13] = columnOut;
        dVar1 = *(double *)((long)pdVar9 + lVar14 * 2 + -8);
        *(double *)((long)pdVar9 + lVar14 * 2 + -8) = pdVar9[lVar13];
        pdVar9[lVar13] = dVar1;
        lVar11 = lVar11 + 1;
      } while (lVar11 < piVar4[(long)columnOut + 1]);
    }
  }
  return;
}

Assistant:

void HMatrix::update(int columnIn, int columnOut) {
    if (columnIn < numCol) {
        for (int k = Astart[columnIn]; k < Astart[columnIn + 1]; k++) {
            int iRow = Aindex[k];
            int iFind = ARstart[iRow];
            int iSwap = --AR_Nend[iRow];
            while (ARindex[iFind] != columnIn)
                iFind++;
            swap(ARindex[iFind], ARindex[iSwap]);
            swap(ARvalue[iFind], ARvalue[iSwap]);
        }
    }

    if (columnOut < numCol) {
        for (int k = Astart[columnOut]; k < Astart[columnOut + 1]; k++) {
            int iRow = Aindex[k];
            int iFind = AR_Nend[iRow];
            int iSwap = AR_Nend[iRow]++;
            while (ARindex[iFind] != columnOut)
                iFind++;
            swap(ARindex[iFind], ARindex[iSwap]);
            swap(ARvalue[iFind], ARvalue[iSwap]);
        }
    }
	//rp_mtx();
}